

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b1wc.c
# Opt level: O0

void xc_hyb_gga_xc_mpw1pw_init(xc_func_type *p)

{
  int iVar1;
  xc_func_type *in_RDI;
  double funcs_coef [2];
  int funcs_id [2];
  double *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar1 = in_RDI->info->number;
  if (((iVar1 != 0x1a2) && (iVar1 != 0x1e3)) && (iVar1 != 0x1e4)) {
    fprintf(_stderr,"Error in hyb_gga_xc_mpw1pw_init\n");
    fflush(_stderr);
    exit(1);
  }
  xc_mix_init((xc_func_type *)0x3ff0000000000000,0x3ff00000,
              (int *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  xc_hyb_init_hybrid(in_RDI,0.0);
  return;
}

Assistant:

void
xc_hyb_gga_xc_mpw1pw_init(xc_func_type *p)
{
  int   funcs_id  [2] = {XC_GGA_X_MPW91, 0};
  double funcs_coef[2] = {1.0, 1.0};

  switch(p->info->number) {
  case(XC_HYB_GGA_XC_MPW1LYP):
    funcs_id[1]=XC_GGA_C_LYP;
    break;
  case(XC_HYB_GGA_XC_MPW1PBE):
    funcs_id[1]=XC_GGA_C_PBE;
    break;
  case(XC_HYB_GGA_XC_MPW1PW):
    funcs_id[1]=XC_GGA_C_PW91;
    break;
  default:
    fprintf(stderr,"Error in hyb_gga_xc_mpw1pw_init\n");
    fflush(stderr);
    exit(1);
  }

  xc_mix_init(p, 2, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, 0.0);
}